

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::~TimerMgr(TimerMgr *this)

{
  reference ppTVar1;
  shared_ptr<hwnet::util::Timer> local_28;
  ulong local_18;
  size_t i;
  TimerMgr *this_local;
  
  i = (size_t)this;
  for (local_18 = 0; local_18 < this->elements_size; local_18 = local_18 + 1) {
    ppTVar1 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,local_18);
    std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
              (&(*ppTVar1)->mCallback,(nullptr_t)0x0);
    std::shared_ptr<hwnet::util::Timer>::shared_ptr(&local_28,(nullptr_t)0x0);
    ppTVar1 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,local_18);
    std::shared_ptr<hwnet::util::Timer>::operator=(&(*ppTVar1)->selfPtr,&local_28);
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&local_28);
  }
  std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::~vector(&this->elements)
  ;
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&this->empty_element_ptr);
  return;
}

Assistant:

~TimerMgr(){
		for(size_t i = 0; i < this->elements_size;i++) {
			this->elements[i]->mCallback = nullptr;
			this->elements[i]->selfPtr = nullptr;
		}
	}